

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O1

int __thiscall
Centaurus::CATNMachine<char>::import_regular_terminal
          (CATNMachine<char> *this,NFA<char> *nfa,int origin,int tag)

{
  pointer pCVar1;
  pointer pCVar2;
  int offset;
  long lVar3;
  long lVar4;
  CharClass<char> local_50;
  
  pCVar1 = (this->m_nodes).
           super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar2 = (this->m_nodes).
           super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_50._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
  local_50.m_ranges.
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.m_ranges.
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.m_ranges.
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  add_node(this,&local_50,origin,tag);
  offset = (int)((ulong)((long)pCVar1 - (long)pCVar2) >> 4) * -0x33333333;
  local_50._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
            (&local_50.m_ranges);
  CATNNode<char>::import_transitions
            ((this->m_nodes).
             super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1,
             (nfa->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
             super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start,offset);
  if (1 < (int)((ulong)((long)(nfa->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
                              super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(nfa->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
                             super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333) {
    lVar3 = 1;
    lVar4 = 0x28;
    do {
      std::vector<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>::
      emplace_back<>(&this->m_nodes);
      CATNNode<char>::import_transitions
                ((this->m_nodes).
                 super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,
                 (NFAState<char> *)
                 ((long)&((nfa->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
                          super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_vptr_NFABaseState + lVar4),
                 offset);
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x28;
    } while (lVar3 < (int)((ulong)((long)(nfa->super_NFABase<Centaurus::NFABaseState<char,_int>_>).
                                         m_states.
                                         super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(nfa->super_NFABase<Centaurus::NFABaseState<char,_int>_>).
                                        m_states.
                                        super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x33333333);
  }
  return (int)((ulong)((long)(this->m_nodes).
                             super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_nodes).
                            super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333 + -1;
}

Assistant:

int import_regular_terminal(const NFA<TCHAR>& nfa, int origin, int tag)
    {
        int offset = m_nodes.size();
        add_node(CharClass<TCHAR>(), origin, tag);
        m_nodes.back().import_transitions(nfa.get_state(0), offset);
        for (int i = 1; i < nfa.get_state_num(); i++)
        {
            m_nodes.emplace_back();
            m_nodes.back().import_transitions(nfa.get_state(i), offset);
        }
        return m_nodes.size() - 1;
    }